

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateZeroInitialize(ExpressionTranslateContext *ctx,ExprZeroInitialize *expression)

{
  _func_int **pp_Var1;
  TypeBase *pTVar2;
  char *format;
  
  pTVar2 = expression->address->type;
  if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x12)) {
    pTVar2 = (TypeBase *)0x0;
  }
  if (pTVar2 == (TypeBase *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x4b3,
                  "void TranslateZeroInitialize(ExpressionTranslateContext &, ExprZeroInitialize *)"
                 );
  }
  pp_Var1 = pTVar2[1]._vptr_TypeBase;
  if (pp_Var1 == (_func_int **)0x0) goto LAB_00145979;
  if (*(int *)(pp_Var1 + 1) == 1) {
    format = "0";
  }
  else {
    if (pp_Var1 == (_func_int **)0x0) goto LAB_00145979;
    if (*(int *)(pp_Var1 + 1) == 2) {
      Print(ctx,"*(");
      Translate(ctx,expression->address);
      format = ") = false";
      goto LAB_0014586f;
    }
    if (pp_Var1 == (_func_int **)0x0) goto LAB_00145979;
    if (*(int *)(pp_Var1 + 1) != 3) {
      if (pp_Var1 == (_func_int **)0x0) goto LAB_00145979;
      if (*(int *)(pp_Var1 + 1) != 4) {
        if (pp_Var1 == (_func_int **)0x0) goto LAB_00145979;
        if (*(int *)(pp_Var1 + 1) != 5) {
          if (pp_Var1 == (_func_int **)0x0) goto LAB_00145979;
          if (*(int *)(pp_Var1 + 1) != 6) {
            if (pp_Var1 == (_func_int **)0x0) goto LAB_00145979;
            if (*(int *)(pp_Var1 + 1) != 9) {
              if (pp_Var1 == (_func_int **)0x0) goto LAB_00145979;
              if (*(int *)(pp_Var1 + 1) != 10) {
                if (pp_Var1 == (_func_int **)0x0) goto LAB_00145979;
                if (*(int *)(pp_Var1 + 1) != 0xb) {
                  if (pp_Var1 == (_func_int **)0x0) {
LAB_00145979:
                    __assert_fail("!\"unknown type\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                  ,0x4db,
                                  "void TranslateZeroInitialize(ExpressionTranslateContext &, ExprZeroInitialize *)"
                                 );
                  }
                  if (*(int *)(pp_Var1 + 1) != 0x12) {
                    if (pp_Var1 != (_func_int **)0x0) {
                      if (*(int *)(pp_Var1 + 1) == 7) {
                        Print(ctx,"*(");
                        Translate(ctx,expression->address);
                        format = ") = 0.0f";
                        goto LAB_0014586f;
                      }
                      if (pp_Var1 != (_func_int **)0x0) {
                        if (*(int *)(pp_Var1 + 1) == 8) {
                          Print(ctx,"*(");
                          Translate(ctx,expression->address);
                          format = ") = 0.0";
                          goto LAB_0014586f;
                        }
                        if ((pp_Var1 != (_func_int **)0x0) &&
                           ((*(int *)(pp_Var1 + 1) == 0x10 ||
                            ((pp_Var1 != (_func_int **)0x0 &&
                             ((*(int *)(pp_Var1 + 1) == 0x11 ||
                              ((pp_Var1 != (_func_int **)0x0 &&
                               ((*(int *)(pp_Var1 + 1) == 0x13 ||
                                ((pp_Var1 != (_func_int **)0x0 &&
                                 ((*(int *)(pp_Var1 + 1) == 0x14 ||
                                  ((pp_Var1 != (_func_int **)0x0 &&
                                   ((*(int *)(pp_Var1 + 1) == 0x15 ||
                                    ((pp_Var1 != (_func_int **)0x0 &&
                                     ((*(int *)(pp_Var1 + 1) == 0x18 ||
                                      ((pp_Var1 != (_func_int **)0x0 &&
                                       (*(int *)(pp_Var1 + 1) == 0x19)))))))))))))))))))))))))) {
                          Print(ctx,"memset(");
                          Translate(ctx,expression->address);
                          Print(ctx,", 0, %d)",(ulong)*(uint *)(pp_Var1 + 6));
                          return;
                        }
                      }
                    }
                    goto LAB_00145979;
                  }
                }
              }
            }
          }
        }
      }
    }
    Print(ctx,"*(");
    Translate(ctx,expression->address);
    format = ") = 0";
  }
LAB_0014586f:
  Print(ctx,format);
  return;
}

Assistant:

void TranslateZeroInitialize(ExpressionTranslateContext &ctx, ExprZeroInitialize *expression)
{
	TypeRef *refType = getType<TypeRef>(expression->address->type);

	assert(refType);

	TypeBase *type = refType->subType;

	if(isType<TypeVoid>(type))
	{
		Print(ctx, "0");
	}
	else if(isType<TypeBool>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = false");
	}
	else if(isType<TypeChar>(type) || isType<TypeShort>(type) || isType<TypeInt>(type) || isType<TypeLong>(type) || isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeNullptr>(type) || isType<TypeRef>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = 0");
	}
	else if(isType<TypeFloat>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = 0.0f");
	}
	else if(isType<TypeDouble>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = 0.0");
	}
	else if(isType<TypeAutoRef>(type) || isType<TypeAutoArray>(type) || isType<TypeArray>(type) || isType<TypeUnsizedArray>(type) || isType<TypeFunction>(type) || isType<TypeClass>(type) || isType<TypeEnum>(type))
	{
		Print(ctx, "memset(");
		Translate(ctx, expression->address);
		Print(ctx, ", 0, %d)", unsigned(type->size));
	}
	else
	{
		assert(!"unknown type");
	}
}